

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_64x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar12;
  ushort uVar19;
  ushort uVar23;
  ushort uVar27;
  ushort uVar31;
  ushort uVar35;
  ushort uVar39;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  undefined1 auVar18 [16];
  int y_mask;
  __m128i round;
  __m128i scaled_bottom_left2;
  __m128i scaled_bottom_left1;
  __m128i top8;
  __m128i top7;
  __m128i top6;
  __m128i top5;
  __m128i top_hihi;
  __m128i top_hilo;
  __m128i inverted_weights2;
  __m128i inverted_weights1;
  __m128i weights2;
  __m128i weights1;
  __m128i weights;
  __m128i top4;
  __m128i top3;
  __m128i top2;
  __m128i top1;
  __m128i top_lohi;
  __m128i top_lolo;
  __m128i zero;
  __m128i scale;
  __m128i bottom_left;
  __m128i pred2_7;
  __m128i pred1_7;
  __m128i pred_sum2_7;
  __m128i pred_sum1_7;
  __m128i weighted_px2_7;
  __m128i weighted_px1_7;
  __m128i pred2_6;
  __m128i pred1_6;
  __m128i pred_sum2_6;
  __m128i pred_sum1_6;
  __m128i weighted_px2_6;
  __m128i weighted_px1_6;
  __m128i pred2_5;
  __m128i pred1_5;
  __m128i pred_sum2_5;
  __m128i pred_sum1_5;
  __m128i weighted_px2_5;
  __m128i weighted_px1_5;
  __m128i pred2_4;
  __m128i pred1_4;
  __m128i pred_sum2_4;
  __m128i pred_sum1_4;
  __m128i weighted_px2_4;
  __m128i weighted_px1_4;
  __m128i pred2_3;
  __m128i pred1_3;
  __m128i pred_sum2_3;
  __m128i pred_sum1_3;
  __m128i weighted_px2_3;
  __m128i weighted_px1_3;
  __m128i pred2_2;
  __m128i pred1_2;
  __m128i pred_sum2_2;
  __m128i pred_sum1_2;
  __m128i weighted_px2_2;
  __m128i weighted_px1_2;
  __m128i pred2_1;
  __m128i pred1_1;
  __m128i pred_sum2_1;
  __m128i pred_sum1_1;
  __m128i weighted_px2_1;
  __m128i weighted_px1_1;
  __m128i pred2;
  __m128i pred1;
  __m128i pred_sum2;
  __m128i pred_sum1;
  __m128i weighted_px2;
  __m128i weighted_px1;
  int local_17cc;
  int local_178c;
  undefined8 *local_1600;
  byte bStack_1540;
  byte bStack_153f;
  byte bStack_153e;
  byte bStack_153d;
  byte bStack_153c;
  byte bStack_153b;
  byte bStack_153a;
  byte bStack_1539;
  byte bStack_1520;
  byte bStack_151f;
  byte bStack_151e;
  byte bStack_151d;
  byte bStack_151c;
  byte bStack_151b;
  byte bStack_151a;
  byte bStack_1519;
  byte bStack_14e0;
  byte bStack_14df;
  byte bStack_14de;
  byte bStack_14dd;
  byte bStack_14dc;
  byte bStack_14db;
  byte bStack_14da;
  byte bStack_14d9;
  byte bStack_14c0;
  byte bStack_14bf;
  byte bStack_14be;
  byte bStack_14bd;
  byte bStack_14bc;
  byte bStack_14bb;
  byte bStack_14ba;
  byte bStack_14b9;
  byte local_1488;
  byte bStack_1487;
  byte bStack_1486;
  byte bStack_1485;
  byte bStack_1484;
  byte bStack_1483;
  byte bStack_1482;
  byte bStack_1481;
  byte local_1448;
  byte bStack_1447;
  byte bStack_1446;
  byte bStack_1445;
  byte bStack_1444;
  byte bStack_1443;
  byte bStack_1442;
  byte bStack_1441;
  byte local_13c8;
  byte bStack_13c7;
  byte bStack_13c6;
  byte bStack_13c5;
  byte bStack_13c4;
  byte bStack_13c3;
  byte bStack_13c2;
  byte bStack_13c1;
  byte local_1388;
  byte bStack_1387;
  byte bStack_1386;
  byte bStack_1385;
  byte bStack_1384;
  byte bStack_1383;
  byte bStack_1382;
  byte bStack_1381;
  ushort uStack_1332;
  ushort uStack_132a;
  ushort uStack_1316;
  ushort uStack_1314;
  ushort uStack_1312;
  ushort uStack_130e;
  ushort uStack_130c;
  ushort uStack_130a;
  ushort uStack_1136;
  ushort uStack_1134;
  ushort uStack_1132;
  ushort uStack_112e;
  ushort uStack_112c;
  ushort uStack_112a;
  ushort uStack_1116;
  ushort uStack_1114;
  ushort uStack_1112;
  ushort uStack_110e;
  ushort uStack_110c;
  ushort uStack_110a;
  ushort uStack_f76;
  ushort uStack_f74;
  ushort uStack_f72;
  ushort uStack_f6e;
  ushort uStack_f6c;
  ushort uStack_f6a;
  ushort uStack_f56;
  ushort uStack_f54;
  ushort uStack_f52;
  ushort uStack_f4e;
  ushort uStack_f4c;
  ushort uStack_f4a;
  ushort uStack_db6;
  ushort uStack_db4;
  ushort uStack_db2;
  ushort uStack_dae;
  ushort uStack_dac;
  ushort uStack_daa;
  ushort uStack_d96;
  ushort uStack_d94;
  ushort uStack_d92;
  ushort uStack_d8e;
  ushort uStack_d8c;
  ushort uStack_d8a;
  short local_c18;
  short sStack_c16;
  short sStack_c14;
  short sStack_c12;
  short sStack_c10;
  short sStack_c0e;
  short sStack_c0c;
  short sStack_c0a;
  ushort uStack_bf6;
  ushort uStack_bf4;
  ushort uStack_bf2;
  ushort uStack_bee;
  ushort uStack_bec;
  ushort uStack_bea;
  short local_be8;
  short sStack_be6;
  short sStack_be4;
  short sStack_be2;
  short sStack_be0;
  short sStack_bde;
  short sStack_bdc;
  short sStack_bda;
  ushort uStack_bd6;
  ushort uStack_bd4;
  ushort uStack_bd2;
  ushort uStack_bce;
  ushort uStack_bcc;
  ushort uStack_bca;
  ushort uStack_a36;
  ushort uStack_a34;
  ushort uStack_a32;
  ushort uStack_a2e;
  ushort uStack_a2c;
  ushort uStack_a2a;
  ushort uStack_a16;
  ushort uStack_a14;
  ushort uStack_a12;
  ushort uStack_a0e;
  ushort uStack_a0c;
  ushort uStack_a0a;
  ushort uStack_876;
  ushort uStack_874;
  ushort uStack_872;
  ushort uStack_86e;
  ushort uStack_86c;
  ushort uStack_86a;
  ushort uStack_856;
  ushort uStack_854;
  ushort uStack_852;
  ushort uStack_84e;
  ushort uStack_84c;
  ushort uStack_84a;
  ushort uStack_6b6;
  ushort uStack_6b4;
  ushort uStack_6b2;
  ushort uStack_6ae;
  ushort uStack_6ac;
  ushort uStack_6aa;
  ushort uStack_696;
  ushort uStack_694;
  ushort uStack_692;
  ushort uStack_68e;
  ushort uStack_68c;
  ushort uStack_68a;
  short local_518;
  short sStack_516;
  short sStack_514;
  short sStack_512;
  short sStack_510;
  short sStack_50e;
  short sStack_50c;
  short sStack_50a;
  ushort uStack_4f6;
  ushort uStack_4f4;
  ushort uStack_4f2;
  ushort uStack_4ee;
  ushort uStack_4ec;
  ushort uStack_4ea;
  short local_4e8;
  short sStack_4e6;
  short sStack_4e4;
  short sStack_4e2;
  short sStack_4e0;
  short sStack_4de;
  short sStack_4dc;
  short sStack_4da;
  ushort uStack_4d6;
  ushort uStack_4d4;
  ushort uStack_4d2;
  ushort uStack_4ce;
  ushort uStack_4cc;
  ushort uStack_4ca;
  __m128i scaled_bottom_left_y_1;
  __m128i weights_y_1;
  __m128i y_select_1;
  int y_mask_1;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  
  bVar1 = *(byte *)(in_RCX + 0xf);
  uVar11 = CONCAT11(0,bVar1);
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  uVar4 = in_RDX[2];
  uVar5 = in_RDX[3];
  local_1388 = (byte)uVar2;
  bStack_1387 = (byte)((ulong)uVar2 >> 8);
  bStack_1386 = (byte)((ulong)uVar2 >> 0x10);
  bStack_1385 = (byte)((ulong)uVar2 >> 0x18);
  bStack_1384 = (byte)((ulong)uVar2 >> 0x20);
  bStack_1383 = (byte)((ulong)uVar2 >> 0x28);
  bStack_1382 = (byte)((ulong)uVar2 >> 0x30);
  bStack_1381 = (byte)((ulong)uVar2 >> 0x38);
  bStack_14c0 = (byte)uVar3;
  bStack_14bf = (byte)((ulong)uVar3 >> 8);
  bStack_14be = (byte)((ulong)uVar3 >> 0x10);
  bStack_14bd = (byte)((ulong)uVar3 >> 0x18);
  bStack_14bc = (byte)((ulong)uVar3 >> 0x20);
  bStack_14bb = (byte)((ulong)uVar3 >> 0x28);
  bStack_14ba = (byte)((ulong)uVar3 >> 0x30);
  bStack_14b9 = (byte)((ulong)uVar3 >> 0x38);
  local_13c8 = (byte)uVar4;
  bStack_13c7 = (byte)((ulong)uVar4 >> 8);
  bStack_13c6 = (byte)((ulong)uVar4 >> 0x10);
  bStack_13c5 = (byte)((ulong)uVar4 >> 0x18);
  bStack_13c4 = (byte)((ulong)uVar4 >> 0x20);
  bStack_13c3 = (byte)((ulong)uVar4 >> 0x28);
  bStack_13c2 = (byte)((ulong)uVar4 >> 0x30);
  bStack_13c1 = (byte)((ulong)uVar4 >> 0x38);
  bStack_14e0 = (byte)uVar5;
  bStack_14df = (byte)((ulong)uVar5 >> 8);
  bStack_14de = (byte)((ulong)uVar5 >> 0x10);
  bStack_14dd = (byte)((ulong)uVar5 >> 0x18);
  bStack_14dc = (byte)((ulong)uVar5 >> 0x20);
  bStack_14db = (byte)((ulong)uVar5 >> 0x28);
  bStack_14da = (byte)((ulong)uVar5 >> 0x30);
  bStack_14d9 = (byte)((ulong)uVar5 >> 0x38);
  uVar2 = in_RDX[4];
  uVar3 = in_RDX[5];
  uVar4 = in_RDX[6];
  uVar5 = in_RDX[7];
  local_1448 = (byte)uVar2;
  bStack_1447 = (byte)((ulong)uVar2 >> 8);
  bStack_1446 = (byte)((ulong)uVar2 >> 0x10);
  bStack_1445 = (byte)((ulong)uVar2 >> 0x18);
  bStack_1444 = (byte)((ulong)uVar2 >> 0x20);
  bStack_1443 = (byte)((ulong)uVar2 >> 0x28);
  bStack_1442 = (byte)((ulong)uVar2 >> 0x30);
  bStack_1441 = (byte)((ulong)uVar2 >> 0x38);
  bStack_1520 = (byte)uVar3;
  bStack_151f = (byte)((ulong)uVar3 >> 8);
  bStack_151e = (byte)((ulong)uVar3 >> 0x10);
  bStack_151d = (byte)((ulong)uVar3 >> 0x18);
  bStack_151c = (byte)((ulong)uVar3 >> 0x20);
  bStack_151b = (byte)((ulong)uVar3 >> 0x28);
  bStack_151a = (byte)((ulong)uVar3 >> 0x30);
  bStack_1519 = (byte)((ulong)uVar3 >> 0x38);
  local_1488 = (byte)uVar4;
  bStack_1487 = (byte)((ulong)uVar4 >> 8);
  bStack_1486 = (byte)((ulong)uVar4 >> 0x10);
  bStack_1485 = (byte)((ulong)uVar4 >> 0x18);
  bStack_1484 = (byte)((ulong)uVar4 >> 0x20);
  bStack_1483 = (byte)((ulong)uVar4 >> 0x28);
  bStack_1482 = (byte)((ulong)uVar4 >> 0x30);
  bStack_1481 = (byte)((ulong)uVar4 >> 0x38);
  bStack_1540 = (byte)uVar5;
  bStack_153f = (byte)((ulong)uVar5 >> 8);
  bStack_153e = (byte)((ulong)uVar5 >> 0x10);
  bStack_153d = (byte)((ulong)uVar5 >> 0x18);
  bStack_153c = (byte)((ulong)uVar5 >> 0x20);
  bStack_153b = (byte)((ulong)uVar5 >> 0x28);
  bStack_153a = (byte)((ulong)uVar5 >> 0x30);
  bStack_1539 = (byte)((ulong)uVar5 >> 0x38);
  uStack_1316 = (ushort)bVar1;
  uStack_1314 = (ushort)bVar1;
  uStack_1312 = (ushort)bVar1;
  uStack_130e = (ushort)bVar1;
  uStack_130c = (ushort)bVar1;
  uStack_130a = (ushort)bVar1;
  uStack_1332 = (ushort)bVar1;
  uStack_132a = (ushort)bVar1;
  local_1600 = in_RDI;
  for (local_178c = 0x1000100; local_178c < 0xf0e0f0f; local_178c = local_178c + 0x2020202) {
    auVar10._8_7_ = 0x540066007b0091;
    auVar10._0_8_ = 0xaa00c400e100ff;
    auVar10[0xf] = 0;
    auVar9._8_8_ = CONCAT44(local_178c,local_178c);
    auVar9._0_8_ = CONCAT44(local_178c,local_178c);
    auVar16 = pshufb(auVar10,auVar9);
    auVar8._2_2_ = uStack_1316 * 0x1f;
    auVar8._0_2_ = uVar11;
    auVar8._4_2_ = uStack_1314 * 0x3c;
    auVar8._6_2_ = uStack_1312 * 0x56;
    auVar8._10_2_ = uStack_130e * 0x85;
    auVar8._8_2_ = uVar11 * 0x6f;
    auVar8._12_2_ = uStack_130c * 0x9a;
    auVar8._14_2_ = uStack_130a * 0xac;
    auVar7._8_8_ = CONCAT44(local_178c,local_178c);
    auVar7._0_8_ = CONCAT44(local_178c,local_178c);
    auVar17 = pshufb(auVar8,auVar7);
    uStack_4d6 = (ushort)bStack_1387;
    uStack_4d4 = (ushort)bStack_1386;
    uStack_4d2 = (ushort)bStack_1385;
    uStack_4ce = (ushort)bStack_1383;
    uStack_4cc = (ushort)bStack_1382;
    uStack_4ca = (ushort)bStack_1381;
    local_4e8 = auVar16._0_2_;
    sStack_4e6 = auVar16._2_2_;
    sStack_4e4 = auVar16._4_2_;
    sStack_4e2 = auVar16._6_2_;
    sStack_4e0 = auVar16._8_2_;
    sStack_4de = auVar16._10_2_;
    sStack_4dc = auVar16._12_2_;
    sStack_4da = auVar16._14_2_;
    uStack_4f6 = (ushort)bStack_14bf;
    uStack_4f4 = (ushort)bStack_14be;
    uStack_4f2 = (ushort)bStack_14bd;
    uStack_4ee = (ushort)bStack_14bb;
    uStack_4ec = (ushort)bStack_14ba;
    uStack_4ea = (ushort)bStack_14b9;
    local_518 = auVar17._0_2_;
    sStack_516 = auVar17._2_2_;
    sStack_514 = auVar17._4_2_;
    sStack_512 = auVar17._6_2_;
    sStack_510 = auVar17._8_2_;
    sStack_50e = auVar17._10_2_;
    sStack_50c = auVar17._12_2_;
    sStack_50a = auVar17._14_2_;
    uVar12 = local_518 + (ushort)local_1388 * local_4e8 + 0x80;
    uVar19 = sStack_516 + uStack_4d6 * sStack_4e6 + 0x80;
    uVar23 = sStack_514 + uStack_4d4 * sStack_4e4 + 0x80;
    uVar27 = sStack_512 + uStack_4d2 * sStack_4e2 + 0x80;
    uVar31 = sStack_510 + (ushort)bStack_1384 * sStack_4e0 + 0x80;
    uVar35 = sStack_50e + uStack_4ce * sStack_4de + 0x80;
    uVar39 = sStack_50c + uStack_4cc * sStack_4dc + 0x80;
    uVar43 = sStack_50a + uStack_4ca * sStack_4da + 0x80;
    uVar13 = uVar12 >> 8;
    uVar20 = uVar19 >> 8;
    uVar24 = uVar23 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar14 = local_518 + (ushort)bStack_14c0 * local_4e8 + 0x80;
    uVar21 = sStack_516 + uStack_4f6 * sStack_4e6 + 0x80;
    uVar25 = sStack_514 + uStack_4f4 * sStack_4e4 + 0x80;
    uVar29 = sStack_512 + uStack_4f2 * sStack_4e2 + 0x80;
    uVar33 = sStack_510 + (ushort)bStack_14bc * sStack_4e0 + 0x80;
    uVar37 = sStack_50e + uStack_4ee * sStack_4de + 0x80;
    uVar41 = sStack_50c + uStack_4ec * sStack_4dc + 0x80;
    uVar45 = sStack_50a + uStack_4ea * sStack_4da + 0x80;
    uVar15 = uVar14 >> 8;
    uVar22 = uVar21 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    *local_1600 = CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44),
                           CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) -
                                    (0xff < uVar40),
                                    CONCAT15((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8)
                                             - (0xff < uVar36),
                                             CONCAT14((uVar32 != 0) * (uVar32 < 0x100) *
                                                      (char)(uVar31 >> 8) - (0xff < uVar32),
                                                      CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                               (char)(uVar27 >> 8) - (0xff < uVar28)
                                                               ,CONCAT12((uVar24 != 0) *
                                                                         (uVar24 < 0x100) *
                                                                         (char)(uVar23 >> 8) -
                                                                         (0xff < uVar24),
                                                                         CONCAT11((uVar20 != 0) *
                                                                                  (uVar20 < 0x100) *
                                                                                  (char)(uVar19 >> 8
                                                                                        ) - (0xff < 
                                                  uVar20),(uVar13 != 0) * (uVar13 < 0x100) *
                                                          (char)(uVar12 >> 8) - (0xff < uVar13))))))
                                   ));
    local_1600[1] =
         CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                  CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42),
                           CONCAT15((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                    (0xff < uVar38),
                                    CONCAT14((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8)
                                             - (0xff < uVar34),
                                             CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                      (char)(uVar29 >> 8) - (0xff < uVar30),
                                                      CONCAT12((uVar26 != 0) * (uVar26 < 0x100) *
                                                               (char)(uVar25 >> 8) - (0xff < uVar26)
                                                               ,CONCAT11((uVar22 != 0) *
                                                                         (uVar22 < 0x100) *
                                                                         (char)(uVar21 >> 8) -
                                                                         (0xff < uVar22),
                                                                         (uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15))))))));
    uStack_696 = (ushort)bStack_13c7;
    uStack_694 = (ushort)bStack_13c6;
    uStack_692 = (ushort)bStack_13c5;
    uStack_68e = (ushort)bStack_13c3;
    uStack_68c = (ushort)bStack_13c2;
    uStack_68a = (ushort)bStack_13c1;
    uStack_6b6 = (ushort)bStack_14df;
    uStack_6b4 = (ushort)bStack_14de;
    uStack_6b2 = (ushort)bStack_14dd;
    uStack_6ae = (ushort)bStack_14db;
    uStack_6ac = (ushort)bStack_14da;
    uStack_6aa = (ushort)bStack_14d9;
    uVar12 = local_518 + (ushort)local_13c8 * local_4e8 + 0x80;
    uVar19 = sStack_516 + uStack_696 * sStack_4e6 + 0x80;
    uVar23 = sStack_514 + uStack_694 * sStack_4e4 + 0x80;
    uVar27 = sStack_512 + uStack_692 * sStack_4e2 + 0x80;
    uVar31 = sStack_510 + (ushort)bStack_13c4 * sStack_4e0 + 0x80;
    uVar35 = sStack_50e + uStack_68e * sStack_4de + 0x80;
    uVar39 = sStack_50c + uStack_68c * sStack_4dc + 0x80;
    uVar43 = sStack_50a + uStack_68a * sStack_4da + 0x80;
    uVar13 = uVar12 >> 8;
    uVar20 = uVar19 >> 8;
    uVar24 = uVar23 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar14 = local_518 + (ushort)bStack_14e0 * local_4e8 + 0x80;
    uVar21 = sStack_516 + uStack_6b6 * sStack_4e6 + 0x80;
    uVar25 = sStack_514 + uStack_6b4 * sStack_4e4 + 0x80;
    uVar29 = sStack_512 + uStack_6b2 * sStack_4e2 + 0x80;
    uVar33 = sStack_510 + (ushort)bStack_14dc * sStack_4e0 + 0x80;
    uVar37 = sStack_50e + uStack_6ae * sStack_4de + 0x80;
    uVar41 = sStack_50c + uStack_6ac * sStack_4dc + 0x80;
    uVar45 = sStack_50a + uStack_6aa * sStack_4da + 0x80;
    uVar15 = uVar14 >> 8;
    uVar22 = uVar21 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    local_1600[2] =
         CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44),
                  CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40),
                           CONCAT15((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) -
                                    (0xff < uVar36),
                                    CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8)
                                             - (0xff < uVar32),
                                             CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                      (char)(uVar27 >> 8) - (0xff < uVar28),
                                                      CONCAT12((uVar24 != 0) * (uVar24 < 0x100) *
                                                               (char)(uVar23 >> 8) - (0xff < uVar24)
                                                               ,CONCAT11((uVar20 != 0) *
                                                                         (uVar20 < 0x100) *
                                                                         (char)(uVar19 >> 8) -
                                                                         (0xff < uVar20),
                                                                         (uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13))))))));
    local_1600[3] =
         CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                  CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42),
                           CONCAT15((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                    (0xff < uVar38),
                                    CONCAT14((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8)
                                             - (0xff < uVar34),
                                             CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                      (char)(uVar29 >> 8) - (0xff < uVar30),
                                                      CONCAT12((uVar26 != 0) * (uVar26 < 0x100) *
                                                               (char)(uVar25 >> 8) - (0xff < uVar26)
                                                               ,CONCAT11((uVar22 != 0) *
                                                                         (uVar22 < 0x100) *
                                                                         (char)(uVar21 >> 8) -
                                                                         (0xff < uVar22),
                                                                         (uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15))))))));
    uStack_856 = (ushort)bStack_1447;
    uStack_854 = (ushort)bStack_1446;
    uStack_852 = (ushort)bStack_1445;
    uStack_84e = (ushort)bStack_1443;
    uStack_84c = (ushort)bStack_1442;
    uStack_84a = (ushort)bStack_1441;
    uStack_876 = (ushort)bStack_151f;
    uStack_874 = (ushort)bStack_151e;
    uStack_872 = (ushort)bStack_151d;
    uStack_86e = (ushort)bStack_151b;
    uStack_86c = (ushort)bStack_151a;
    uStack_86a = (ushort)bStack_1519;
    uVar12 = local_518 + (ushort)local_1448 * local_4e8 + 0x80;
    uVar19 = sStack_516 + uStack_856 * sStack_4e6 + 0x80;
    uVar23 = sStack_514 + uStack_854 * sStack_4e4 + 0x80;
    uVar27 = sStack_512 + uStack_852 * sStack_4e2 + 0x80;
    uVar31 = sStack_510 + (ushort)bStack_1444 * sStack_4e0 + 0x80;
    uVar35 = sStack_50e + uStack_84e * sStack_4de + 0x80;
    uVar39 = sStack_50c + uStack_84c * sStack_4dc + 0x80;
    uVar43 = sStack_50a + uStack_84a * sStack_4da + 0x80;
    uVar13 = uVar12 >> 8;
    uVar20 = uVar19 >> 8;
    uVar24 = uVar23 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar14 = local_518 + (ushort)bStack_1520 * local_4e8 + 0x80;
    uVar21 = sStack_516 + uStack_876 * sStack_4e6 + 0x80;
    uVar25 = sStack_514 + uStack_874 * sStack_4e4 + 0x80;
    uVar29 = sStack_512 + uStack_872 * sStack_4e2 + 0x80;
    uVar33 = sStack_510 + (ushort)bStack_151c * sStack_4e0 + 0x80;
    uVar37 = sStack_50e + uStack_86e * sStack_4de + 0x80;
    uVar41 = sStack_50c + uStack_86c * sStack_4dc + 0x80;
    uVar45 = sStack_50a + uStack_86a * sStack_4da + 0x80;
    uVar15 = uVar14 >> 8;
    uVar22 = uVar21 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    local_1600[4] =
         CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44),
                  CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40),
                           CONCAT15((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) -
                                    (0xff < uVar36),
                                    CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8)
                                             - (0xff < uVar32),
                                             CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                      (char)(uVar27 >> 8) - (0xff < uVar28),
                                                      CONCAT12((uVar24 != 0) * (uVar24 < 0x100) *
                                                               (char)(uVar23 >> 8) - (0xff < uVar24)
                                                               ,CONCAT11((uVar20 != 0) *
                                                                         (uVar20 < 0x100) *
                                                                         (char)(uVar19 >> 8) -
                                                                         (0xff < uVar20),
                                                                         (uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13))))))));
    local_1600[5] =
         CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                  CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42),
                           CONCAT15((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                    (0xff < uVar38),
                                    CONCAT14((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8)
                                             - (0xff < uVar34),
                                             CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                      (char)(uVar29 >> 8) - (0xff < uVar30),
                                                      CONCAT12((uVar26 != 0) * (uVar26 < 0x100) *
                                                               (char)(uVar25 >> 8) - (0xff < uVar26)
                                                               ,CONCAT11((uVar22 != 0) *
                                                                         (uVar22 < 0x100) *
                                                                         (char)(uVar21 >> 8) -
                                                                         (0xff < uVar22),
                                                                         (uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15))))))));
    uStack_a16 = (ushort)bStack_1487;
    uStack_a14 = (ushort)bStack_1486;
    uStack_a12 = (ushort)bStack_1485;
    uStack_a0e = (ushort)bStack_1483;
    uStack_a0c = (ushort)bStack_1482;
    uStack_a0a = (ushort)bStack_1481;
    uStack_a36 = (ushort)bStack_153f;
    uStack_a34 = (ushort)bStack_153e;
    uStack_a32 = (ushort)bStack_153d;
    uStack_a2e = (ushort)bStack_153b;
    uStack_a2c = (ushort)bStack_153a;
    uStack_a2a = (ushort)bStack_1539;
    uVar12 = local_518 + (ushort)local_1488 * local_4e8 + 0x80;
    uVar19 = sStack_516 + uStack_a16 * sStack_4e6 + 0x80;
    uVar23 = sStack_514 + uStack_a14 * sStack_4e4 + 0x80;
    uVar27 = sStack_512 + uStack_a12 * sStack_4e2 + 0x80;
    uVar31 = sStack_510 + (ushort)bStack_1484 * sStack_4e0 + 0x80;
    uVar35 = sStack_50e + uStack_a0e * sStack_4de + 0x80;
    uVar39 = sStack_50c + uStack_a0c * sStack_4dc + 0x80;
    uVar43 = sStack_50a + uStack_a0a * sStack_4da + 0x80;
    uVar13 = uVar12 >> 8;
    uVar20 = uVar19 >> 8;
    uVar24 = uVar23 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar14 = local_518 + (ushort)bStack_1540 * local_4e8 + 0x80;
    uVar21 = sStack_516 + uStack_a36 * sStack_4e6 + 0x80;
    uVar25 = sStack_514 + uStack_a34 * sStack_4e4 + 0x80;
    uVar29 = sStack_512 + uStack_a32 * sStack_4e2 + 0x80;
    uVar33 = sStack_510 + (ushort)bStack_153c * sStack_4e0 + 0x80;
    uVar37 = sStack_50e + uStack_a2e * sStack_4de + 0x80;
    uVar41 = sStack_50c + uStack_a2c * sStack_4dc + 0x80;
    uVar45 = sStack_50a + uStack_a2a * sStack_4da + 0x80;
    uVar15 = uVar14 >> 8;
    uVar22 = uVar21 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    local_1600[6] =
         CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44),
                  CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40),
                           CONCAT15((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) -
                                    (0xff < uVar36),
                                    CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8)
                                             - (0xff < uVar32),
                                             CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                      (char)(uVar27 >> 8) - (0xff < uVar28),
                                                      CONCAT12((uVar24 != 0) * (uVar24 < 0x100) *
                                                               (char)(uVar23 >> 8) - (0xff < uVar24)
                                                               ,CONCAT11((uVar20 != 0) *
                                                                         (uVar20 < 0x100) *
                                                                         (char)(uVar19 >> 8) -
                                                                         (0xff < uVar20),
                                                                         (uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13))))))));
    local_1600[7] =
         CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                  CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42),
                           CONCAT15((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                    (0xff < uVar38),
                                    CONCAT14((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8)
                                             - (0xff < uVar34),
                                             CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                      (char)(uVar29 >> 8) - (0xff < uVar30),
                                                      CONCAT12((uVar26 != 0) * (uVar26 < 0x100) *
                                                               (char)(uVar25 >> 8) - (0xff < uVar26)
                                                               ,CONCAT11((uVar22 != 0) *
                                                                         (uVar22 < 0x100) *
                                                                         (char)(uVar21 >> 8) -
                                                                         (0xff < uVar22),
                                                                         (uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15))))))));
    local_1600 = (undefined8 *)(in_RSI + (long)local_1600);
  }
  for (local_17cc = 0x1000100; local_17cc < 0xf0e0f0f; local_17cc = local_17cc + 0x2020202) {
    auVar6._8_7_ = 0x1000110014001a;
    auVar6._0_8_ = 0x21002b00360044;
    auVar6[0xf] = 0;
    auVar18._8_8_ = CONCAT44(local_17cc,local_17cc);
    auVar18._0_8_ = CONCAT44(local_17cc,local_17cc);
    auVar18 = pshufb(auVar6,auVar18);
    auVar17._2_2_ = uStack_1316 * 0xca;
    auVar17._0_2_ = uVar11 * 0xbc;
    auVar17._4_2_ = uStack_1314 * 0xd5;
    auVar17._6_2_ = uStack_1332 * 0xdf;
    auVar17._10_2_ = uStack_130e * 0xec;
    auVar17._8_2_ = uVar11 * 0xe6;
    auVar17._12_2_ = uStack_130c * 0xef;
    auVar17._14_2_ = uStack_132a * 0xf0;
    auVar16._8_8_ = CONCAT44(local_17cc,local_17cc);
    auVar16._0_8_ = CONCAT44(local_17cc,local_17cc);
    auVar16 = pshufb(auVar17,auVar16);
    uStack_bd6 = (ushort)bStack_1387;
    uStack_bd4 = (ushort)bStack_1386;
    uStack_bd2 = (ushort)bStack_1385;
    uStack_bce = (ushort)bStack_1383;
    uStack_bcc = (ushort)bStack_1382;
    uStack_bca = (ushort)bStack_1381;
    local_be8 = auVar18._0_2_;
    sStack_be6 = auVar18._2_2_;
    sStack_be4 = auVar18._4_2_;
    sStack_be2 = auVar18._6_2_;
    sStack_be0 = auVar18._8_2_;
    sStack_bde = auVar18._10_2_;
    sStack_bdc = auVar18._12_2_;
    sStack_bda = auVar18._14_2_;
    uStack_bf6 = (ushort)bStack_14bf;
    uStack_bf4 = (ushort)bStack_14be;
    uStack_bf2 = (ushort)bStack_14bd;
    uStack_bee = (ushort)bStack_14bb;
    uStack_bec = (ushort)bStack_14ba;
    uStack_bea = (ushort)bStack_14b9;
    local_c18 = auVar16._0_2_;
    sStack_c16 = auVar16._2_2_;
    sStack_c14 = auVar16._4_2_;
    sStack_c12 = auVar16._6_2_;
    sStack_c10 = auVar16._8_2_;
    sStack_c0e = auVar16._10_2_;
    sStack_c0c = auVar16._12_2_;
    sStack_c0a = auVar16._14_2_;
    uVar12 = local_c18 + (ushort)local_1388 * local_be8 + 0x80;
    uVar19 = sStack_c16 + uStack_bd6 * sStack_be6 + 0x80;
    uVar23 = sStack_c14 + uStack_bd4 * sStack_be4 + 0x80;
    uVar27 = sStack_c12 + uStack_bd2 * sStack_be2 + 0x80;
    uVar31 = sStack_c10 + (ushort)bStack_1384 * sStack_be0 + 0x80;
    uVar35 = sStack_c0e + uStack_bce * sStack_bde + 0x80;
    uVar39 = sStack_c0c + uStack_bcc * sStack_bdc + 0x80;
    uVar43 = sStack_c0a + uStack_bca * sStack_bda + 0x80;
    uVar13 = uVar12 >> 8;
    uVar20 = uVar19 >> 8;
    uVar24 = uVar23 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar14 = local_c18 + (ushort)bStack_14c0 * local_be8 + 0x80;
    uVar21 = sStack_c16 + uStack_bf6 * sStack_be6 + 0x80;
    uVar25 = sStack_c14 + uStack_bf4 * sStack_be4 + 0x80;
    uVar29 = sStack_c12 + uStack_bf2 * sStack_be2 + 0x80;
    uVar33 = sStack_c10 + (ushort)bStack_14bc * sStack_be0 + 0x80;
    uVar37 = sStack_c0e + uStack_bee * sStack_bde + 0x80;
    uVar41 = sStack_c0c + uStack_bec * sStack_bdc + 0x80;
    uVar45 = sStack_c0a + uStack_bea * sStack_bda + 0x80;
    uVar15 = uVar14 >> 8;
    uVar22 = uVar21 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    *local_1600 = CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44),
                           CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) -
                                    (0xff < uVar40),
                                    CONCAT15((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8)
                                             - (0xff < uVar36),
                                             CONCAT14((uVar32 != 0) * (uVar32 < 0x100) *
                                                      (char)(uVar31 >> 8) - (0xff < uVar32),
                                                      CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                               (char)(uVar27 >> 8) - (0xff < uVar28)
                                                               ,CONCAT12((uVar24 != 0) *
                                                                         (uVar24 < 0x100) *
                                                                         (char)(uVar23 >> 8) -
                                                                         (0xff < uVar24),
                                                                         CONCAT11((uVar20 != 0) *
                                                                                  (uVar20 < 0x100) *
                                                                                  (char)(uVar19 >> 8
                                                                                        ) - (0xff < 
                                                  uVar20),(uVar13 != 0) * (uVar13 < 0x100) *
                                                          (char)(uVar12 >> 8) - (0xff < uVar13))))))
                                   ));
    local_1600[1] =
         CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                  CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42),
                           CONCAT15((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                    (0xff < uVar38),
                                    CONCAT14((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8)
                                             - (0xff < uVar34),
                                             CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                      (char)(uVar29 >> 8) - (0xff < uVar30),
                                                      CONCAT12((uVar26 != 0) * (uVar26 < 0x100) *
                                                               (char)(uVar25 >> 8) - (0xff < uVar26)
                                                               ,CONCAT11((uVar22 != 0) *
                                                                         (uVar22 < 0x100) *
                                                                         (char)(uVar21 >> 8) -
                                                                         (0xff < uVar22),
                                                                         (uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15))))))));
    uStack_d96 = (ushort)bStack_13c7;
    uStack_d94 = (ushort)bStack_13c6;
    uStack_d92 = (ushort)bStack_13c5;
    uStack_d8e = (ushort)bStack_13c3;
    uStack_d8c = (ushort)bStack_13c2;
    uStack_d8a = (ushort)bStack_13c1;
    uStack_db6 = (ushort)bStack_14df;
    uStack_db4 = (ushort)bStack_14de;
    uStack_db2 = (ushort)bStack_14dd;
    uStack_dae = (ushort)bStack_14db;
    uStack_dac = (ushort)bStack_14da;
    uStack_daa = (ushort)bStack_14d9;
    uVar12 = local_c18 + (ushort)local_13c8 * local_be8 + 0x80;
    uVar19 = sStack_c16 + uStack_d96 * sStack_be6 + 0x80;
    uVar23 = sStack_c14 + uStack_d94 * sStack_be4 + 0x80;
    uVar27 = sStack_c12 + uStack_d92 * sStack_be2 + 0x80;
    uVar31 = sStack_c10 + (ushort)bStack_13c4 * sStack_be0 + 0x80;
    uVar35 = sStack_c0e + uStack_d8e * sStack_bde + 0x80;
    uVar39 = sStack_c0c + uStack_d8c * sStack_bdc + 0x80;
    uVar43 = sStack_c0a + uStack_d8a * sStack_bda + 0x80;
    uVar13 = uVar12 >> 8;
    uVar20 = uVar19 >> 8;
    uVar24 = uVar23 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar14 = local_c18 + (ushort)bStack_14e0 * local_be8 + 0x80;
    uVar21 = sStack_c16 + uStack_db6 * sStack_be6 + 0x80;
    uVar25 = sStack_c14 + uStack_db4 * sStack_be4 + 0x80;
    uVar29 = sStack_c12 + uStack_db2 * sStack_be2 + 0x80;
    uVar33 = sStack_c10 + (ushort)bStack_14dc * sStack_be0 + 0x80;
    uVar37 = sStack_c0e + uStack_dae * sStack_bde + 0x80;
    uVar41 = sStack_c0c + uStack_dac * sStack_bdc + 0x80;
    uVar45 = sStack_c0a + uStack_daa * sStack_bda + 0x80;
    uVar15 = uVar14 >> 8;
    uVar22 = uVar21 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    local_1600[2] =
         CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44),
                  CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40),
                           CONCAT15((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) -
                                    (0xff < uVar36),
                                    CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8)
                                             - (0xff < uVar32),
                                             CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                      (char)(uVar27 >> 8) - (0xff < uVar28),
                                                      CONCAT12((uVar24 != 0) * (uVar24 < 0x100) *
                                                               (char)(uVar23 >> 8) - (0xff < uVar24)
                                                               ,CONCAT11((uVar20 != 0) *
                                                                         (uVar20 < 0x100) *
                                                                         (char)(uVar19 >> 8) -
                                                                         (0xff < uVar20),
                                                                         (uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13))))))));
    local_1600[3] =
         CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                  CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42),
                           CONCAT15((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                    (0xff < uVar38),
                                    CONCAT14((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8)
                                             - (0xff < uVar34),
                                             CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                      (char)(uVar29 >> 8) - (0xff < uVar30),
                                                      CONCAT12((uVar26 != 0) * (uVar26 < 0x100) *
                                                               (char)(uVar25 >> 8) - (0xff < uVar26)
                                                               ,CONCAT11((uVar22 != 0) *
                                                                         (uVar22 < 0x100) *
                                                                         (char)(uVar21 >> 8) -
                                                                         (0xff < uVar22),
                                                                         (uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15))))))));
    uStack_f56 = (ushort)bStack_1447;
    uStack_f54 = (ushort)bStack_1446;
    uStack_f52 = (ushort)bStack_1445;
    uStack_f4e = (ushort)bStack_1443;
    uStack_f4c = (ushort)bStack_1442;
    uStack_f4a = (ushort)bStack_1441;
    uStack_f76 = (ushort)bStack_151f;
    uStack_f74 = (ushort)bStack_151e;
    uStack_f72 = (ushort)bStack_151d;
    uStack_f6e = (ushort)bStack_151b;
    uStack_f6c = (ushort)bStack_151a;
    uStack_f6a = (ushort)bStack_1519;
    uVar12 = local_c18 + (ushort)local_1448 * local_be8 + 0x80;
    uVar19 = sStack_c16 + uStack_f56 * sStack_be6 + 0x80;
    uVar23 = sStack_c14 + uStack_f54 * sStack_be4 + 0x80;
    uVar27 = sStack_c12 + uStack_f52 * sStack_be2 + 0x80;
    uVar31 = sStack_c10 + (ushort)bStack_1444 * sStack_be0 + 0x80;
    uVar35 = sStack_c0e + uStack_f4e * sStack_bde + 0x80;
    uVar39 = sStack_c0c + uStack_f4c * sStack_bdc + 0x80;
    uVar43 = sStack_c0a + uStack_f4a * sStack_bda + 0x80;
    uVar13 = uVar12 >> 8;
    uVar20 = uVar19 >> 8;
    uVar24 = uVar23 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar14 = local_c18 + (ushort)bStack_1520 * local_be8 + 0x80;
    uVar21 = sStack_c16 + uStack_f76 * sStack_be6 + 0x80;
    uVar25 = sStack_c14 + uStack_f74 * sStack_be4 + 0x80;
    uVar29 = sStack_c12 + uStack_f72 * sStack_be2 + 0x80;
    uVar33 = sStack_c10 + (ushort)bStack_151c * sStack_be0 + 0x80;
    uVar37 = sStack_c0e + uStack_f6e * sStack_bde + 0x80;
    uVar41 = sStack_c0c + uStack_f6c * sStack_bdc + 0x80;
    uVar45 = sStack_c0a + uStack_f6a * sStack_bda + 0x80;
    uVar15 = uVar14 >> 8;
    uVar22 = uVar21 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    local_1600[4] =
         CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44),
                  CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40),
                           CONCAT15((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) -
                                    (0xff < uVar36),
                                    CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8)
                                             - (0xff < uVar32),
                                             CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                      (char)(uVar27 >> 8) - (0xff < uVar28),
                                                      CONCAT12((uVar24 != 0) * (uVar24 < 0x100) *
                                                               (char)(uVar23 >> 8) - (0xff < uVar24)
                                                               ,CONCAT11((uVar20 != 0) *
                                                                         (uVar20 < 0x100) *
                                                                         (char)(uVar19 >> 8) -
                                                                         (0xff < uVar20),
                                                                         (uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13))))))));
    local_1600[5] =
         CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                  CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42),
                           CONCAT15((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                    (0xff < uVar38),
                                    CONCAT14((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8)
                                             - (0xff < uVar34),
                                             CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                      (char)(uVar29 >> 8) - (0xff < uVar30),
                                                      CONCAT12((uVar26 != 0) * (uVar26 < 0x100) *
                                                               (char)(uVar25 >> 8) - (0xff < uVar26)
                                                               ,CONCAT11((uVar22 != 0) *
                                                                         (uVar22 < 0x100) *
                                                                         (char)(uVar21 >> 8) -
                                                                         (0xff < uVar22),
                                                                         (uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15))))))));
    uStack_1116 = (ushort)bStack_1487;
    uStack_1114 = (ushort)bStack_1486;
    uStack_1112 = (ushort)bStack_1485;
    uStack_110e = (ushort)bStack_1483;
    uStack_110c = (ushort)bStack_1482;
    uStack_110a = (ushort)bStack_1481;
    uStack_1136 = (ushort)bStack_153f;
    uStack_1134 = (ushort)bStack_153e;
    uStack_1132 = (ushort)bStack_153d;
    uStack_112e = (ushort)bStack_153b;
    uStack_112c = (ushort)bStack_153a;
    uStack_112a = (ushort)bStack_1539;
    uVar12 = local_c18 + (ushort)local_1488 * local_be8 + 0x80;
    uVar19 = sStack_c16 + uStack_1116 * sStack_be6 + 0x80;
    uVar23 = sStack_c14 + uStack_1114 * sStack_be4 + 0x80;
    uVar27 = sStack_c12 + uStack_1112 * sStack_be2 + 0x80;
    uVar31 = sStack_c10 + (ushort)bStack_1484 * sStack_be0 + 0x80;
    uVar35 = sStack_c0e + uStack_110e * sStack_bde + 0x80;
    uVar39 = sStack_c0c + uStack_110c * sStack_bdc + 0x80;
    uVar43 = sStack_c0a + uStack_110a * sStack_bda + 0x80;
    uVar13 = uVar12 >> 8;
    uVar20 = uVar19 >> 8;
    uVar24 = uVar23 >> 8;
    uVar28 = uVar27 >> 8;
    uVar32 = uVar31 >> 8;
    uVar36 = uVar35 >> 8;
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar14 = local_c18 + (ushort)bStack_1540 * local_be8 + 0x80;
    uVar21 = sStack_c16 + uStack_1136 * sStack_be6 + 0x80;
    uVar25 = sStack_c14 + uStack_1134 * sStack_be4 + 0x80;
    uVar29 = sStack_c12 + uStack_1132 * sStack_be2 + 0x80;
    uVar33 = sStack_c10 + (ushort)bStack_153c * sStack_be0 + 0x80;
    uVar37 = sStack_c0e + uStack_112e * sStack_bde + 0x80;
    uVar41 = sStack_c0c + uStack_112c * sStack_bdc + 0x80;
    uVar45 = sStack_c0a + uStack_112a * sStack_bda + 0x80;
    uVar15 = uVar14 >> 8;
    uVar22 = uVar21 >> 8;
    uVar26 = uVar25 >> 8;
    uVar30 = uVar29 >> 8;
    uVar34 = uVar33 >> 8;
    uVar38 = uVar37 >> 8;
    uVar42 = uVar41 >> 8;
    uVar46 = uVar45 >> 8;
    local_1600[6] =
         CONCAT17((uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44),
                  CONCAT16((uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40),
                           CONCAT15((uVar36 != 0) * (uVar36 < 0x100) * (char)(uVar35 >> 8) -
                                    (0xff < uVar36),
                                    CONCAT14((uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8)
                                             - (0xff < uVar32),
                                             CONCAT13((uVar28 != 0) * (uVar28 < 0x100) *
                                                      (char)(uVar27 >> 8) - (0xff < uVar28),
                                                      CONCAT12((uVar24 != 0) * (uVar24 < 0x100) *
                                                               (char)(uVar23 >> 8) - (0xff < uVar24)
                                                               ,CONCAT11((uVar20 != 0) *
                                                                         (uVar20 < 0x100) *
                                                                         (char)(uVar19 >> 8) -
                                                                         (0xff < uVar20),
                                                                         (uVar13 != 0) *
                                                                         (uVar13 < 0x100) *
                                                                         (char)(uVar12 >> 8) -
                                                                         (0xff < uVar13))))))));
    local_1600[7] =
         CONCAT17((uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar45 >> 8) - (0xff < uVar46),
                  CONCAT16((uVar42 != 0) * (uVar42 < 0x100) * (char)(uVar41 >> 8) - (0xff < uVar42),
                           CONCAT15((uVar38 != 0) * (uVar38 < 0x100) * (char)(uVar37 >> 8) -
                                    (0xff < uVar38),
                                    CONCAT14((uVar34 != 0) * (uVar34 < 0x100) * (char)(uVar33 >> 8)
                                             - (0xff < uVar34),
                                             CONCAT13((uVar30 != 0) * (uVar30 < 0x100) *
                                                      (char)(uVar29 >> 8) - (0xff < uVar30),
                                                      CONCAT12((uVar26 != 0) * (uVar26 < 0x100) *
                                                               (char)(uVar25 >> 8) - (0xff < uVar26)
                                                               ,CONCAT11((uVar22 != 0) *
                                                                         (uVar22 < 0x100) *
                                                                         (char)(uVar21 >> 8) -
                                                                         (0xff < uVar22),
                                                                         (uVar15 != 0) *
                                                                         (uVar15 < 0x100) *
                                                                         (char)(uVar14 >> 8) -
                                                                         (0xff < uVar15))))))));
    local_1600 = (undefined8 *)(in_RSI + (long)local_1600);
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_64x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[15]);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top_lolo = LoadUnaligned16(top_row);
  const __m128i top_lohi = LoadUnaligned16(top_row + 16);
  const __m128i top1 = cvtepu8_epi16(top_lolo);
  const __m128i top2 = _mm_unpackhi_epi8(top_lolo, zero);
  const __m128i top3 = cvtepu8_epi16(top_lohi);
  const __m128i top4 = _mm_unpackhi_epi8(top_lohi, zero);

  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i weights1 = cvtepu8_epi16(weights);
  const __m128i weights2 = _mm_unpackhi_epi8(weights, zero);
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i top_hilo = LoadUnaligned16(top_row + 32);
  const __m128i top_hihi = LoadUnaligned16(top_row + 48);
  const __m128i top5 = cvtepu8_epi16(top_hilo);
  const __m128i top6 = _mm_unpackhi_epi8(top_hilo, zero);
  const __m128i top7 = cvtepu8_epi16(top_hihi);
  const __m128i top8 = _mm_unpackhi_epi8(top_hihi, zero);
  const __m128i scaled_bottom_left1 =
      _mm_mullo_epi16(inverted_weights1, bottom_left);
  const __m128i scaled_bottom_left2 =
      _mm_mullo_epi16(inverted_weights2, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights1, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left1, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights2, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left2, y_select);
    write_smooth_directional_sum16(dst, top1, top2, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 16, top3, top4, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 32, top5, top6, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    write_smooth_directional_sum16(dst + 48, top7, top8, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}